

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar12;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  int *piVar9;
  long *plVar10;
  Layer *pLVar11;
  undefined1 auVar13 [16];
  Mat *pMVar14;
  Option *pOVar15;
  void *pvVar16;
  Allocator *_allocator;
  ulong uVar17;
  int iVar18;
  size_t totalsize;
  long lVar19;
  long lVar20;
  ulong uVar21;
  void *pvVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  void *pvVar26;
  long lVar27;
  float fVar28;
  int *out;
  ParamDict pd;
  undefined1 local_5e8 [16];
  long local_5d8;
  Allocator *pAStack_5d0;
  undefined4 local_5c8;
  int iStack_5c4;
  int iStack_5c0;
  uint uStack_5bc;
  ulong local_5b8;
  void *local_5b0;
  Mat *local_5a8;
  Option *local_5a0;
  Mat local_598;
  long local_558;
  ModelBinFromMatArray local_550;
  ParamDict local_540;
  
  iVar1 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar12 = bottom_blob->c;
  _allocator = opt->blob_allocator;
  Mat::create(top_blob,this->num_output,bottom_blob->elemsize,_allocator);
  iVar23 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar25 = uVar3 * iVar1;
    if (this->use_int8_inference == false) {
      iVar23 = this->num_output;
      if (0 < (long)iVar23) {
        iVar18 = this->bias_term;
        pvVar16 = (this->bias_data).data;
        pvVar4 = (this->weight_data).data;
        pvVar5 = bottom_blob->data;
        sVar6 = bottom_blob->cstep;
        pvVar7 = top_blob->data;
        sVar8 = bottom_blob->elemsize;
        iVar24 = 0;
        lVar19 = 0;
        do {
          if (iVar18 == 0) {
            fVar28 = 0.0;
          }
          else {
            fVar28 = *(float *)((long)pvVar16 + lVar19 * 4);
          }
          if (0 < (int)uVar12) {
            pvVar26 = (void *)((long)pvVar4 + (long)iVar24 * 4);
            uVar17 = 0;
            pvVar22 = pvVar5;
            do {
              if (0 < (int)uVar25) {
                uVar21 = 0;
                do {
                  fVar28 = fVar28 + *(float *)((long)pvVar26 + uVar21 * 4) *
                                    *(float *)((long)pvVar22 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar25 != uVar21);
              }
              uVar17 = uVar17 + 1;
              pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar25 * 4);
              pvVar22 = (void *)((long)pvVar22 + sVar6 * sVar8);
            } while (uVar17 != (uint)uVar12);
          }
          *(float *)((long)pvVar7 + lVar19 * 4) = fVar28;
          lVar19 = lVar19 + 1;
          iVar24 = iVar24 + uVar3 * uVar12 * iVar1;
        } while (lVar19 != iVar23);
      }
      iVar23 = 0;
    }
    else {
      pAStack_5d0 = opt->workspace_allocator;
      auVar13._4_4_ = -(uint)(uVar3 == 0);
      auVar13._0_4_ = -(uint)(iVar1 == 0);
      auVar13._8_4_ = -(uint)(uVar12 == 0);
      auVar13._12_4_ = 0;
      movmskps((int)_allocator,auVar13 << 0x20);
      local_5e8 = (undefined1  [16])0x0;
      local_5d8 = 1;
      iStack_5c4 = iVar1;
      local_5c8 = 3;
      iStack_5c0 = uVar3;
      local_5b8 = (long)(int)uVar25 + 0xfU & 0xfffffffffffffff0;
      lVar19 = (long)(int)uVar12 * local_5b8;
      local_5a0 = opt;
      uStack_5bc = uVar12;
      if (lVar19 != 0) {
        if (pAStack_5d0 == (Allocator *)0x0) {
          pvVar16 = malloc(lVar19 + 0x1c);
          local_5e8._0_8_ = (long)pvVar16 + 0x17U & 0xfffffffffffffff0;
          *(void **)(local_5e8._0_8_ - 8) = pvVar16;
        }
        else {
          local_5e8._0_8_ = (*(code *)**(undefined8 **)pAStack_5d0)(pAStack_5d0);
        }
        local_5e8._8_8_ = local_5e8._0_8_ + lVar19;
        *(undefined4 *)(local_5e8._0_8_ + lVar19) = 1;
      }
      iVar23 = -100;
      if ((local_5e8._0_8_ != 0) && ((long)(int)uStack_5bc * local_5b8 != 0)) {
        ParamDict::ParamDict(&local_540);
        ParamDict::set(&local_540,0,this->bottom_blob_int8_scale);
        pOVar15 = local_5a0;
        (*this->quantize->_vptr_Layer[2])(this->quantize,&local_540);
        (*this->quantize->_vptr_Layer[5])(this->quantize,bottom_blob,local_5e8,pOVar15);
        lVar19 = 0x4d8;
        do {
          piVar9 = *(int **)((long)local_540.params + lVar19 + -8);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              lVar27 = *(long *)((long)local_540.params + lVar19 + -0x10);
              plVar10 = *(long **)((long)&local_540.params[0].v.data + lVar19);
              if (plVar10 == (long *)0x0) {
                if (lVar27 != 0) {
                  free(*(void **)(lVar27 + -8));
                }
              }
              else {
                (**(code **)(*plVar10 + 8))();
              }
            }
          }
          *(undefined1 (*) [16])((long)local_540.params + lVar19 + -0x10) = (undefined1  [16])0x0;
          *(undefined8 *)((long)&local_540.params[0].loaded + lVar19) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.allocator + lVar19) = 0;
          *(undefined1 (*) [16])((long)&local_540.params[0].v.refcount + lVar19) =
               (undefined1  [16])0x0;
          lVar19 = lVar19 + -0x40;
        } while (lVar19 != -0x28);
        if (0 < this->num_output) {
          pvVar16 = top_blob->data;
          local_5b0 = (this->weight_data).data;
          local_558 = local_5e8._0_8_;
          iVar23 = 0;
          lVar19 = 0;
          do {
            iVar18 = 0;
            if (0 < (int)uVar12) {
              lVar20 = (long)iVar23 + (long)local_5b0;
              uVar17 = 0;
              iVar18 = 0;
              lVar27 = local_5e8._0_8_;
              do {
                if (0 < (int)uVar25) {
                  uVar21 = 0;
                  do {
                    iVar18 = iVar18 + (int)*(char *)(lVar20 + uVar21) *
                                      (int)*(char *)(lVar27 + uVar21);
                    uVar21 = uVar21 + 1;
                  } while (uVar25 != uVar21);
                }
                uVar17 = uVar17 + 1;
                lVar20 = lVar20 + (int)uVar25;
                lVar27 = lVar27 + local_5b8 * local_5d8;
              } while (uVar17 != (uint)uVar12);
            }
            *(int *)((long)pvVar16 + lVar19 * 4) = iVar18;
            lVar19 = lVar19 + 1;
            iVar23 = iVar23 + uVar3 * uVar12 * iVar1;
          } while (lVar19 < this->num_output);
        }
        fVar28 = this->weight_data_int8_scale;
        fVar2 = this->bottom_blob_int8_scale;
        local_5a8 = top_blob;
        ParamDict::ParamDict(&local_540);
        ParamDict::set(&local_540,0,1.0 / (fVar28 * fVar2));
        pMVar14 = local_5a8;
        ParamDict::set(&local_540,1,this->bias_term);
        ParamDict::set(&local_540,2,this->num_output);
        (*this->dequantize->_vptr_Layer[2])(this->dequantize,&local_540);
        local_598.dims = 0;
        local_598.w = 0;
        local_598.h = 0;
        local_598.c = 0;
        local_598.elemsize = 0;
        local_598.allocator = (Allocator *)0x0;
        local_598.data = (void *)0x0;
        local_598.refcount = (int *)0x0;
        local_598.cstep = 0;
        if (&local_598 != &this->bias_data) {
          piVar9 = (this->bias_data).refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + 1;
            UNLOCK();
          }
          local_598.data = (this->bias_data).data;
          local_598.refcount = (this->bias_data).refcount;
          local_598.elemsize = (this->bias_data).elemsize;
          local_598.allocator = (this->bias_data).allocator;
          local_598.dims = (this->bias_data).dims;
          local_598.w = (this->bias_data).w;
          local_598.h = (this->bias_data).h;
          local_598.c = (this->bias_data).c;
          local_598.cstep = (this->bias_data).cstep;
        }
        pLVar11 = this->dequantize;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_550,&local_598);
        (*pLVar11->_vptr_Layer[3])(pLVar11,&local_550);
        (*this->dequantize->_vptr_Layer[7])(this->dequantize,pMVar14,local_5a0);
        if (local_598.refcount != (int *)0x0) {
          LOCK();
          *local_598.refcount = *local_598.refcount + -1;
          UNLOCK();
          if (*local_598.refcount == 0) {
            if (local_598.allocator == (Allocator *)0x0) {
              if (local_598.data != (void *)0x0) {
                free(*(void **)((long)local_598.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_598.allocator + 8))();
            }
          }
        }
        lVar19 = 0x4d8;
        do {
          piVar9 = *(int **)((long)local_540.params + lVar19 + -8);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              lVar27 = *(long *)((long)local_540.params + lVar19 + -0x10);
              plVar10 = *(long **)((long)&local_540.params[0].v.data + lVar19);
              if (plVar10 == (long *)0x0) {
                if (lVar27 != 0) {
                  free(*(void **)(lVar27 + -8));
                }
              }
              else {
                (**(code **)(*plVar10 + 8))();
              }
            }
          }
          *(undefined8 *)((long)local_540.params + lVar19 + -0x10) = 0;
          *(undefined8 *)((long)local_540.params + lVar19 + -8) = 0;
          *(undefined8 *)((long)&local_540.params[0].loaded + lVar19) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.allocator + lVar19) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.refcount + lVar19) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.elemsize + lVar19) = 0;
          lVar19 = lVar19 + -0x40;
        } while (lVar19 != -0x28);
        iVar23 = 0;
      }
      if ((int *)local_5e8._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_5e8._8_8_ = *(int *)local_5e8._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_5e8._8_8_ == 0) {
          if (pAStack_5d0 == (Allocator *)0x0) {
            if (local_5e8._0_8_ != 0) {
              free(*(void **)(local_5e8._0_8_ + -8));
            }
          }
          else {
            (**(code **)(*(long *)pAStack_5d0 + 8))();
          }
        }
      }
    }
  }
  return iVar23;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->forward(bottom_blob, bottom_blob_int8, opt);
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_int8.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;
        }

        // dequantize, reverse scale inplace
        {
            float top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scale);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, num_output);// bias_data_size

            dequantize->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data;

            dequantize->load_model(ModelBinFromMatArray(weights));

            dequantize->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = sum;
    }

    return 0;
}